

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase193::run(TestCase193 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  StructSchema schema;
  Builder field;
  Builder type;
  Builder root;
  Builder fields;
  Builder local_1b8;
  IndexingIterator<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Builder,_capnp::schema::Field::Builder>
  local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  SchemaLoader loader;
  DebugComparison<kj::String,_kj::String> _kjCondition;
  
  SchemaLoader::SchemaLoader(&loader);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestOldVersion>
            (&loader);
  local_158 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  uStack_150 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  _kjCondition.left.content.ptr =
       (char *)SchemaLoader::get(&loader,0x95b30dd14e01dda8,brand,(Schema)0x669c88);
  schema = Schema::asStruct((Schema *)&_kjCondition);
  local_188.container = (Builder *)(schemas::s_95b30dd14e01dda8 + 0x48);
  Schema::getProto((Reader *)&fields,(Schema *)&local_188);
  kj::str<capnp::schema::Node::Reader>((String *)&type,(Reader *)&fields);
  field._builder.segment = type._builder.segment;
  field._builder.capTable = type._builder.capTable;
  field._builder.data = type._builder.data;
  type._builder._0_16_ = ZEXT816(0);
  Schema::getProto((Reader *)&root,&schema.super_Schema);
  kj::str<capnp::schema::Node::Reader>((String *)&local_1b8,(Reader *)&root);
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&field,(String *)&local_1b8);
  kj::Array<char>::~Array((Array<char> *)&local_1b8);
  kj::Array<char>::~Array((Array<char> *)&field);
  kj::Array<char>::~Array((Array<char> *)&type);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1b8._builder.segment = (SegmentBuilder *)(schemas::s_95b30dd14e01dda8 + 0x48);
    Schema::getProto((Reader *)&fields,(Schema *)&local_1b8);
    kj::str<capnp::schema::Node::Reader>((String *)&field,(Reader *)&fields);
    Schema::getProto((Reader *)&root,&schema.super_Schema);
    kj::str<capnp::schema::Node::Reader>((String *)&type,(Reader *)&root);
    kj::_::Debug::
    log<char_const(&)[108],kj::_::DebugComparison<kj::String,kj::String>&,kj::String,kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"(kj::str(Schema::from<test::TestOldVersion>().getProto())) == (kj::str(schema.getProto()))\", _kjCondition, kj::str(Schema::from<test::TestOldVersion>().getProto()), kj::str(schema.getProto())"
               ,(char (*) [108])
                "failed: expected (kj::str(Schema::from<test::TestOldVersion>().getProto())) == (kj::str(schema.getProto()))"
               ,&_kjCondition,(String *)&field,(String *)&type);
    kj::Array<char>::~Array((Array<char> *)&type);
    kj::Array<char>::~Array((Array<char> *)&field);
  }
  kj::_::DebugComparison<kj::String,_kj::String>::~DebugComparison(&_kjCondition);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,0x400,GROW_HEURISTICALLY);
  root._builder.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  Schema::getProto((Reader *)&fields,(Schema *)&root);
  MessageBuilder::setRoot<capnp::schema::Node::Reader>
            ((MessageBuilder *)&_kjCondition,(Reader *)&fields);
  MessageBuilder::getRoot<capnp::schema::Node>(&root,(MessageBuilder *)&_kjCondition);
  *(undefined8 *)root._builder.data = 0x95b30dd14e01dda8;
  if (*(short *)((long)root._builder.data + 0xc) == 1) {
    field._builder.dataSize = root._builder.dataSize;
    field._builder.pointerCount = root._builder.pointerCount;
    field._builder._38_2_ = root._builder._38_2_;
    field._builder.data = root._builder.data;
    field._builder.pointers = root._builder.pointers;
    field._builder.capTable = root._builder.capTable;
    field._builder.segment = root._builder.segment;
    capnp::schema::Node::Struct::Builder::getFields(&fields,(Builder *)&field);
    local_188.container = &fields;
    for (local_188.index = 0; local_188.index != fields.builder.elementCount;
        local_188.index = local_188.index + 1) {
      IndexingIterator<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Builder,_capnp::schema::Field::Builder>
      ::operator*(&field,&local_188);
      if (*(short *)((long)field._builder.data + 8) == 0) {
        local_1b8._builder.dataSize = field._builder.dataSize;
        local_1b8._builder.pointerCount = field._builder.pointerCount;
        local_1b8._builder._38_2_ = field._builder._38_2_;
        local_1b8._builder.data = field._builder.data;
        local_1b8._builder.pointers = field._builder.pointers;
        local_1b8._builder.segment = field._builder.segment;
        local_1b8._builder.capTable = field._builder.capTable;
        capnp::schema::Field::Slot::Builder::getType(&type,&local_1b8);
        if ((*type._builder.data == 0x10) &&
           (*(long *)((long)type._builder.data + 8) == -0x7128a58b960fb31d)) {
          *(undefined8 *)((long)type._builder.data + 8) = 0x95b30dd14e01dda8;
        }
      }
    }
  }
  StructBuilder::asReader(&root._builder);
  SchemaLoader::load(&loader,(Reader *)&fields);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  local_1b8._builder.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  Schema::getProto((Reader *)&fields,(Schema *)&local_1b8);
  field._builder._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&fields);
  Schema::getProto((Reader *)&root,&schema.super_Schema);
  type._builder._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&root);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<capnp::Text::Reader> *)&field,(Reader *)&type);
  if (((char)_kjCondition.op.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1b8._builder.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
    Schema::getProto((Reader *)&fields,(Schema *)&local_1b8);
    field._builder._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&fields);
    Schema::getProto((Reader *)&root,&schema.super_Schema);
    type._builder._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&root);
    kj::_::Debug::
    log<char_const(&)[124],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xcf,ERROR,
               "\"failed: expected \" \"(Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())\", _kjCondition, Schema::from<test::TestNewVersion>().getProto().getDisplayName(), schema.getProto().getDisplayName()"
               ,(char (*) [124])
                "failed: expected (Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())"
               ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&_kjCondition,
               (Reader *)&field,(Reader *)&type);
  }
  Schema::requireUsableAs<capnproto_test::capnp::test::TestOldVersion>(&schema.super_Schema);
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Upgrade) {
  SchemaLoader loader;

  loader.loadCompiledTypeAndDependencies<test::TestOldVersion>();

  StructSchema schema = loader.get(typeId<test::TestOldVersion>()).asStruct();

  EXPECT_EQ(kj::str(Schema::from<test::TestOldVersion>().getProto()),
            kj::str(schema.getProto()));

  loadUnderAlternateTypeId<test::TestNewVersion>(loader, typeId<test::TestOldVersion>());

  // The new version replaced the old.
  EXPECT_EQ(Schema::from<test::TestNewVersion>().getProto().getDisplayName(),
            schema.getProto().getDisplayName());

  // But it is still usable as the old version.
  schema.requireUsableAs<test::TestOldVersion>();
}